

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper
          (PathTypeHandlerBase *this,Type *type,ObjectSlotAttributes *attributes,
          EquivalentPropertyEntry *entry)

{
  PropertyId propId;
  byte bVar1;
  bool bVar2;
  uint16 uVar3;
  PropertyIndex slotIndex;
  PropertyIndex PVar4;
  TypePath *pTVar5;
  byte local_52;
  ObjectSlotAttributes local_51;
  int maxInitializedLength;
  PropertyIndex relSlotIndex;
  ObjectSlotAttributes attr;
  PropertyIndex absSlotIndex;
  EquivalentPropertyEntry *entry_local;
  ObjectSlotAttributes *attributes_local;
  Type *type_local;
  PathTypeHandlerBase *this_local;
  
  pTVar5 = GetTypePath(this);
  propId = entry->propertyId;
  uVar3 = GetPathLength(this);
  slotIndex = TypePath::LookupInline(pTVar5,propId,(uint)uVar3);
  if (slotIndex == 0xffff) {
    if ((entry->slotIndex != 0xffff) || ((entry->mustBeWritable & 1U) != 0)) {
      return false;
    }
  }
  else {
    if (attributes == (ObjectSlotAttributes *)0x0) {
      local_51 = ObjectSlotAttr_Default;
    }
    else {
      local_51 = attributes[slotIndex];
    }
    if ((local_51 & ObjectSlotAttr_Deleted) != ObjectSlotAttr_None) {
      local_52 = 0;
      if (entry->slotIndex == 0xffff) {
        local_52 = entry->mustBeWritable ^ 0xff;
      }
      return (bool)(local_52 & 1);
    }
    if ((local_51 & ObjectSlotAttr_Accessor) != ObjectSlotAttr_None) {
      return false;
    }
    PVar4 = DynamicTypeHandler::AdjustValidSlotIndexForInlineSlots
                      (&this->super_DynamicTypeHandler,slotIndex);
    if ((PVar4 != entry->slotIndex) ||
       (uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler),
       uVar3 <= slotIndex != (bool)(entry->isAuxSlot & 1U))) {
      return false;
    }
    if ((entry->mustBeWritable & 1U) != 0) {
      if ((local_51 & ObjectSlotAttr_Writable) == ObjectSlotAttr_None) {
        return false;
      }
      pTVar5 = GetTypePath(this);
      bVar1 = TypePath::GetMaxInitializedLength(pTVar5);
      bVar2 = FixPropsOnPathTypes();
      if (bVar2) {
        if (slotIndex < bVar1) {
          pTVar5 = GetTypePath(this);
          uVar3 = GetPathLength(this);
          bVar2 = TypePath::GetIsFixedFieldAt(pTVar5,slotIndex,(uint)uVar3);
          if (!bVar2) {
            return true;
          }
        }
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper(const Type* type, const ObjectSlotAttributes * attributes, const EquivalentPropertyEntry *entry)
    {
        Js::PropertyIndex absSlotIndex = GetTypePath()->LookupInline(entry->propertyId, GetPathLength());

        if (absSlotIndex != Constants::NoSlot)
        {
            ObjectSlotAttributes attr = attributes ? attributes[absSlotIndex] : ObjectSlotAttr_Default;

            if (attr & ObjectSlotAttr_Deleted)
            {
                return entry->slotIndex == Constants::NoSlot && !entry->mustBeWritable;
            }

            if (attr & ObjectSlotAttr_Accessor)
            {
                return false;
            }

            Js::PropertyIndex relSlotIndex = AdjustValidSlotIndexForInlineSlots(absSlotIndex);
            if (relSlotIndex != entry->slotIndex || ((absSlotIndex >= GetInlineSlotCapacity()) != entry->isAuxSlot))
            {
                return false;
            }

            if (entry->mustBeWritable)
            {
                if (!(attr & ObjectSlotAttr_Writable))
                {
                    return false;
                }

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
                int maxInitializedLength = this->GetTypePath()->GetMaxInitializedLength();
                if (FixPropsOnPathTypes() && (absSlotIndex >= maxInitializedLength || this->GetTypePath()->GetIsFixedFieldAt(absSlotIndex, this->GetPathLength())))
                {
                    return false;
                }
#endif
            }
        }
        else
        {
            if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
            {
                return false;
            }
        }

        return true;
    }